

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFOpcPackage::~D3MFOpcPackage(D3MFOpcPackage *this)

{
  pointer pZVar1;
  D3MFOpcPackage *this_local;
  
  pZVar1 = std::
           unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           ::operator->(&this->mZipArchive);
  (*(pZVar1->super_IOSystem)._vptr_IOSystem[5])(pZVar1,this->mRootStream);
  std::unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>::
  ~unique_ptr(&this->mZipArchive);
  return;
}

Assistant:

D3MFOpcPackage::~D3MFOpcPackage() {
    mZipArchive->Close(mRootStream);
}